

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::validate_compare_to_all_valid_elements
          (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *this,const_iterator *it)

{
  bool bVar1;
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  const_iterator cur;
  undefined1 local_20 [7];
  bool found_match;
  flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  *local_18;
  const_iterator *it_local;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  *this_local;
  
  local_18 = it;
  it_local = (const_iterator *)this;
  end((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
       *)local_20);
  bVar1 = flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator!=((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)local_20,local_18);
  if (bVar1) {
    cur.p_._7_1_ = 0;
    cbegin((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
            *)local_30);
    while( true ) {
      cend((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
            *)local_38);
      bVar1 = flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
              ::operator!=((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                            *)local_30,
                           (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                            *)local_38);
      if (!bVar1) break;
      bVar1 = flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
              ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                            *)local_30,local_18);
      if (bVar1) {
        cur.p_._7_1_ = 1;
        break;
      }
      flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      ::operator++((flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                    *)local_30);
    }
    if ((cur.p_._7_1_ & 1) == 0) {
      std::terminate();
    }
  }
  return;
}

Assistant:

void validate_compare_to_all_valid_elements([[maybe_unused]] const_iterator const &it) const noexcept {
#ifdef FFL_DBG_CHECK_ITERATOR_VALID
        //
        // If not end iterator then must point to one of the valid iterators.
        //
        if (end() != it) {
            bool found_match{ false };
            for (auto cur = cbegin(); cur != cend(); ++cur) {
                if (cur == it) {
                    found_match = true;
                    break;
                }
            }
            FFL_CODDING_ERROR_IF_NOT(found_match);
        }
#else //FFL_DBG_CHECK_ITERATOR_VALID
        it;
#endif //FFL_DBG_CHECK_ITERATOR_VALID
    }